

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O1

int __thiscall pg::SSISolver::mark_solved(SSISolver *this,int side)

{
  bitset *pbVar1;
  int **ppiVar2;
  int **ppiVar3;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint64_t *puVar8;
  uint64_t *puVar9;
  Game *pGVar10;
  uint *puVar11;
  bool bVar12;
  size_t sVar13;
  ostream *poVar14;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  size_t sVar18;
  ulong uVar19;
  int iVar20;
  size_t sVar21;
  int *piVar22;
  int from;
  int *piVar23;
  int iVar24;
  uint *puVar25;
  char *pcVar26;
  int to;
  ulong uVar27;
  long lVar28;
  bool bVar29;
  _label_vertex local_80;
  int **local_70;
  int **local_68;
  int *local_60;
  int **local_58;
  long local_50;
  uint64_t *local_48;
  _label_vertex local_40;
  
  pbVar1 = &this->C;
  puVar8 = (this->C)._bits;
  sVar13 = (this->C)._bitssize;
  iVar15 = 0;
  sVar18 = 0;
  do {
    sVar21 = sVar18;
    if (sVar13 == sVar21) {
      return 0;
    }
    sVar18 = sVar21 + 1;
  } while (puVar8[sVar21] == 0);
  if (sVar13 != sVar21) {
    ppiVar3 = &this->str0;
    ppiVar2 = &this->str1;
    bVar29 = side != 0;
    local_58 = ppiVar2;
    if (!bVar29) {
      local_58 = ppiVar3;
    }
    sVar13 = (&this->W0)[bVar29]._bitssize;
    if (sVar13 != 0) {
      puVar9 = (&this->W0)[bVar29]._bits;
      sVar18 = 0;
      do {
        puVar4 = puVar9 + sVar18;
        *puVar4 = *puVar4 | puVar8[sVar18];
        sVar18 = sVar18 + 1;
      } while (sVar13 != sVar18);
    }
    for (sVar13 = bitset::find_first(pbVar1); sVar13 != 0xffffffffffffffff;
        sVar13 = bitset::find_next(pbVar1,sVar13)) {
      iVar15 = (this->Q).pointer;
      (this->Q).pointer = iVar15 + 1;
      (this->Q).queue[iVar15] = (uint)sVar13;
    }
    iVar24 = (this->Q).pointer;
    if (iVar24 == 0) {
      iVar15 = 0;
    }
    else {
      pGVar10 = (this->super_Solver).game;
      puVar11 = (this->Q).queue;
      piVar22 = pGVar10->_inedges;
      local_60 = pGVar10->_firstins;
      puVar8 = (this->G)._bits;
      iVar15 = 0;
      do {
        (this->Q).pointer = iVar24 + -1;
        uVar5 = puVar11[(long)iVar24 + -1];
        local_50 = (long)(int)uVar5;
        uVar6 = piVar22[local_60[local_50]];
        if (uVar6 != 0xffffffff) {
          piVar23 = piVar22 + local_60[local_50];
          local_48 = pbVar1->_bits;
          do {
            uVar27 = (ulong)(int)uVar6;
            uVar19 = uVar27 >> 6;
            if ((puVar8[uVar19] >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
              uVar16 = 1L << ((ulong)uVar6 & 0x3f);
              puVar9 = (&this->W0)[bVar29]._bits;
              if ((puVar9[uVar19] & uVar16) == 0) {
                if ((uint)(((pGVar10->_owner)._bits[uVar19] & uVar16) != 0) == side) {
                  (*local_58)[uVar27] = uVar5;
                }
                else {
                  uVar7 = pGVar10->_outedges[pGVar10->_firstouts[uVar27]];
                  if (uVar7 != 0xffffffff) {
                    puVar25 = (uint *)(pGVar10->_outedges + (long)pGVar10->_firstouts[uVar27] + 1);
                    bVar17 = false;
                    do {
                      if (((puVar8[(ulong)(long)(int)uVar7 >> 6] >> ((ulong)uVar7 & 0x3f) & 1) == 0)
                         || ((puVar9[(ulong)(long)(int)uVar7 >> 6] & 1L << ((ulong)uVar7 & 0x3f)) !=
                             0)) {
                        bVar12 = true;
                      }
                      else {
                        bVar17 = true;
                        bVar12 = false;
                      }
                      if (!bVar12) break;
                      uVar7 = *puVar25;
                      puVar25 = puVar25 + 1;
                    } while (uVar7 != 0xffffffff);
                    if (bVar17) goto LAB_001677e9;
                  }
                }
                local_48[uVar19] = local_48[uVar19] | uVar16;
                puVar9[uVar19] = puVar9[uVar19] | uVar16;
                iVar24 = (this->Q).pointer;
                (this->Q).pointer = iVar24 + 1;
                puVar11[iVar24] = uVar6;
              }
            }
LAB_001677e9:
            uVar6 = piVar23[1];
            piVar23 = piVar23 + 1;
          } while (uVar6 != 0xffffffff);
        }
        iVar15 = iVar15 + 1;
        iVar24 = (this->Q).pointer;
      } while (iVar24 != 0);
    }
    local_70 = ppiVar2;
    local_68 = ppiVar3;
    if ((1 < (this->super_Solver).trace) &&
       (sVar13 = bitset::find_first(pbVar1), sVar13 != 0xffffffffffffffff)) {
      pcVar26 = "Odd";
      if (side == 0) {
        pcVar26 = "Even";
      }
      lVar28 = (ulong)(side == 0) + 3;
      do {
        iVar24 = (int)sVar13;
        if ((uint)(((((this->super_Solver).game)->_owner)._bits[(ulong)(long)iVar24 >> 6] >>
                    (sVar13 & 0x3f) & 1) != 0) == side) {
          poVar14 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[1;37mvertex ",0xe);
          local_80.g = (this->super_Solver).game;
          local_80.v = iVar24;
          poVar14 = operator<<(poVar14,&local_80);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," is now won by ",0xf);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar26,lVar28);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," with strategy ",0xf);
          local_40.v = (&this->str0)[bVar29][sVar13];
          local_40.g = (this->super_Solver).game;
          poVar14 = operator<<(poVar14,&local_40);
        }
        else {
          poVar14 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[1;37mvertex ",0xe);
          local_80.g = (this->super_Solver).game;
          local_80.v = iVar24;
          poVar14 = operator<<(poVar14,&local_80);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," is now won by ",0xf);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar26,lVar28);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!\x1b[m",4);
        std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        sVar13 = bitset::find_next(pbVar1,sVar13);
      } while (sVar13 != 0xffffffffffffffff);
    }
    ppiVar3 = local_68;
    ppiVar2 = local_70;
    sVar13 = (this->G)._bitssize;
    if (sVar13 != 0) {
      puVar8 = (&this->W0)[bVar29]._bits;
      puVar9 = (this->G)._bits;
      sVar18 = 0;
      do {
        puVar4 = puVar9 + sVar18;
        *puVar4 = *puVar4 & ~puVar8[sVar18];
        sVar18 = sVar18 + 1;
      } while (sVar13 != sVar18);
    }
    sVar13 = (this->V0)._bitssize;
    if (sVar13 != 0) {
      puVar8 = (this->G)._bits;
      puVar9 = (this->V0)._bits;
      sVar18 = 0;
      do {
        puVar4 = puVar9 + sVar18;
        *puVar4 = *puVar4 & puVar8[sVar18];
        sVar18 = sVar18 + 1;
      } while (sVar13 != sVar18);
    }
    sVar13 = (this->V1)._bitssize;
    if (sVar13 != 0) {
      puVar8 = (this->G)._bits;
      puVar9 = (this->V1)._bits;
      sVar18 = 0;
      do {
        puVar4 = puVar9 + sVar18;
        *puVar4 = *puVar4 & puVar8[sVar18];
        sVar18 = sVar18 + 1;
      } while (sVar13 != sVar18);
    }
    sVar13 = (this->halt0)._bitssize;
    if (sVar13 != 0) {
      memset((this->halt0)._bits,0,sVar13 << 3);
    }
    pbVar1 = &this->G;
    sVar13 = (this->halt1)._bitssize;
    if (sVar13 != 0) {
      memset((this->halt1)._bits,0,sVar13 << 3);
    }
    for (uVar19 = bitset::find_first(pbVar1); uVar19 != 0xffffffffffffffff;
        uVar19 = bitset::find_next(pbVar1,uVar19)) {
      uVar27 = (ulong)(*ppiVar3)[uVar19];
      puVar8 = pbVar1->_bits;
      uVar27 = 1L << (uVar27 & 0x3f) & puVar8[uVar27 >> 6];
      if ((uVar27 == 0) ||
         (uVar16 = (ulong)(*ppiVar2)[uVar19], (puVar8[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0)) {
        pGVar10 = (this->super_Solver).game;
        piVar22 = pGVar10->_outedges;
        lVar28 = (long)pGVar10->_firstouts[(int)uVar19];
        iVar24 = piVar22[lVar28];
        if (iVar24 == -1) {
          iVar20 = -1;
        }
        else {
          piVar22 = piVar22 + lVar28 + 1;
          do {
            iVar20 = iVar24;
            if ((puVar8[(ulong)(long)iVar24 >> 6] >> ((long)iVar24 & 0x3fU) & 1) != 0) break;
            iVar24 = *piVar22;
            piVar22 = piVar22 + 1;
            iVar20 = -1;
          } while (iVar24 != -1);
        }
        if (uVar27 == 0) {
          (*ppiVar3)[uVar19] = iVar20;
        }
        piVar22 = *ppiVar2;
        uVar27 = (ulong)piVar22[uVar19];
        if ((puVar8[uVar27 >> 6] >> (uVar27 & 0x3f) & 1) == 0) {
          piVar22[uVar19] = iVar20;
        }
      }
      puVar4 = (&this->halt0)
               [(*(byte *)(((this->super_Solver).game)->_priority + (int)uVar19) & 1) == 0]._bits +
               (uVar19 >> 6);
      *puVar4 = *puVar4 | 1L << (uVar19 & 0x3f);
    }
  }
  return iVar15;
}

Assistant:

int
SSISolver::mark_solved(int side)
{
    if (C.none()) return 0;

    auto & W = side == 0 ? W0 : W1;
    auto & S = side == 0 ? str0 : str1;

    // the vertices in C are the new winning region (dominion)
    W |= C;

    // attract to the winning region
    int count = 0;
    for (auto v = C.find_first(); v != bitset::npos; v = C.find_next(v)) {
        Q.push(v);
    }
    while (Q.nonempty()) {
        auto v = Q.pop();
        count++;
        for (auto curedge = ins(v); *curedge != -1; curedge++) {
            auto from = *curedge;
            if (G[from] and !W[from]) {
                if (owner(from) != side) {
                    // check if escapes
                    bool escapes = false;
                    for (auto curedge = outs(from); *curedge != -1; curedge++) {
                        auto to = *curedge;
                        if (G[to] && !W[to]) {
                            escapes = true;
                            break;
                        }
                    }
                    if (escapes) continue;
                } else {
                    S[from] = v;
                }
                C[from] = true;
                W[from] = true;
                Q.push(from);
            }
        }
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (auto v = C.find_first(); v != bitset::npos; v = C.find_next(v)) {
            if (owner(v) == side) {
                logger << "\033[1;37mvertex " << label_vertex(v) << " is now won by " << (side == 0 ? "Even" : "Odd") << " with strategy " << label_vertex(S[v]) << "!\033[m" << std::endl;
            } else {
                logger << "\033[1;37mvertex " << label_vertex(v) << " is now won by " << (side == 0 ? "Even" : "Odd") << "!\033[m" << std::endl;
            }
        }
    }
#endif

    // remove maximized winning region from remaining game
    G -= W;
    V0 &= G;
    V1 &= G;

    // partially reset the strategies and reset halting
    halt0.reset();
    halt1.reset();
    for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
        if (!G[str0[v]] || !G[str1[v]]) {
            // select first available edge
            int to = -1;
            for (auto curedge = outs(v); *curedge != -1; curedge++) {
                int u = *curedge;
                if (G[u]) {
                    to = u;
                    break;
                }
            }
            if (!G[str0[v]]) str0[v] = to;
            if (!G[str1[v]]) str1[v] = to;
        }

        if (priority(v)&1) {
            halt0[v] = true;
        } else {
            halt1[v] = true;
        }
    }

    return count;
}